

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionValidatesLengthAndChecksum::RunImpl
          (TestsessionFixtureSessionValidatesLengthAndChecksum *this)

{
  TestDetails *details;
  sessionFixtureSessionValidatesLengthAndChecksumHelper fixtureHelper;
  sessionFixtureSessionValidatesLengthAndChecksumHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionValidatesLengthAndChecksumHelper::
  sessionFixtureSessionValidatesLengthAndChecksumHelper(&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionValidatesLengthAndChecksumHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionValidatesLengthAndChecksum) {
  createSession(1);
  object->setValidateLengthAndChecksum(true);
  CHECK(object->getValidateLengthAndChecksum());
}